

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O3

Interval * tcu::operator*(Interval *__return_storage_ptr__,Interval *x,Interval *y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  deRoundingMode dVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_98;
  double local_78;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar10 = x->m_lo;
  local_98 = x->m_hi;
  if (dVar10 <= local_98) {
    dVar11 = y->m_lo;
    dVar9 = y->m_hi;
    if (dVar11 <= dVar9) {
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar11 = dVar11 * dVar10;
      dVar9 = dVar11;
      if (NAN(dVar11)) {
        dVar9 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar12 = y->m_hi;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar10 = dVar10 * dVar12;
      dVar12 = dVar10;
      if (NAN(dVar10)) {
        dVar12 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar13 = (double)(-(ulong)NAN(dVar11) & 0xfff0000000000000 |
                       ~-(ulong)NAN(dVar11) & (ulong)dVar11);
      dVar2 = (double)(-(ulong)NAN(dVar10) & 0xfff0000000000000 |
                      ~-(ulong)NAN(dVar10) & (ulong)dVar10);
      bVar7 = -(NAN(dVar11) || NAN(dVar10));
      dVar10 = (double)(~-(ulong)(dVar9 <= dVar12) & (ulong)dVar12 |
                       (ulong)dVar9 & -(ulong)(dVar9 <= dVar12));
      uVar8 = -(ulong)(dVar2 <= dVar13);
      local_78 = (double)(~uVar8 & (ulong)dVar2 | uVar8 & (ulong)dVar13);
      local_98 = x->m_hi;
      dVar11 = y->m_lo;
      dVar9 = y->m_hi;
    }
    else {
      bVar7 = 0;
      dVar10 = INFINITY;
      local_78 = -INFINITY;
    }
    dVar13 = INFINITY;
    dVar12 = -INFINITY;
    bVar1 = y->m_hasNaN;
    if (dVar11 <= dVar9) {
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar11 = dVar11 * local_98;
      dVar9 = dVar11;
      if (NAN(dVar11)) {
        dVar9 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar12 = y->m_hi;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      local_98 = local_98 * dVar12;
      dVar12 = local_98;
      if (NAN(local_98)) {
        dVar12 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar2 = (double)(-(ulong)NAN(dVar11) & 0xfff0000000000000 |
                      ~-(ulong)NAN(dVar11) & (ulong)dVar11);
      dVar3 = (double)(-(ulong)NAN(local_98) & 0xfff0000000000000 |
                      ~-(ulong)NAN(local_98) & (ulong)local_98);
      bVar4 = (bool)((-NAN(dVar11) | -NAN(local_98)) & 1);
      dVar13 = (double)(~-(ulong)(dVar9 <= dVar12) & (ulong)dVar12 |
                       (ulong)dVar9 & -(ulong)(dVar9 <= dVar12));
      uVar8 = -(ulong)(dVar3 <= dVar2);
      dVar12 = (double)(~uVar8 & (ulong)dVar3 | uVar8 & (ulong)dVar2);
      bVar6 = y->m_hasNaN;
    }
    else {
      bVar4 = false;
      bVar6 = bVar1;
    }
    if ((bVar6 & 1) != 0) {
      bVar4 = true;
    }
    if (((bVar1 | bVar7) & 1) != 0) {
      bVar4 = true;
    }
    dVar10 = (double)(~-(ulong)(dVar10 <= dVar13) & (ulong)dVar13 |
                     (ulong)dVar10 & -(ulong)(dVar10 <= dVar13));
    dVar11 = (double)(~-(ulong)(dVar12 <= local_78) & (ulong)dVar12 |
                     (ulong)local_78 & -(ulong)(dVar12 <= local_78));
  }
  else {
    dVar10 = INFINITY;
    dVar11 = -INFINITY;
    bVar4 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar4;
  __return_storage_ptr__->m_lo = dVar10;
  __return_storage_ptr__->m_hi = dVar11;
  if (x->m_hasNaN == true) {
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = dVar10;
    __return_storage_ptr__->m_hi = dVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

Interval operator* (const Interval& x, const Interval& y)
{
	Interval ret;

	TCU_INTERVAL_APPLY_MONOTONE2(ret, xp, x, yp, y, val,
								 TCU_SET_INTERVAL(val, point, point = xp * yp));
	return ret;
}